

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_neg_8_al(void)

{
  uint addr_in;
  uint uVar1;
  uint addr_in_00;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in_00 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in_00 = pmmu_translate_addr(addr_in_00);
  }
  addr_in = m68k_read_memory_32(addr_in_00 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(addr_in);
  }
  uVar1 = m68k_read_memory_8(uVar1 & m68ki_cpu.address_mask);
  m68ki_cpu.x_flag = -uVar1;
  m68ki_cpu.v_flag = uVar1 & m68ki_cpu.x_flag;
  uVar1 = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.not_z_flag = uVar1;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,uVar1);
  return;
}

Assistant:

static void m68k_op_neg_8_al(void)
{
	uint ea = EA_AL_8();
	uint src = m68ki_read_8(ea);
	uint res = 0 - src;

	FLAG_N = NFLAG_8(res);
	FLAG_C = FLAG_X = CFLAG_8(res);
	FLAG_V = src & res;
	FLAG_Z = MASK_OUT_ABOVE_8(res);

	m68ki_write_8(ea, FLAG_Z);
}